

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O3

void __thiscall Worker::run_tasks(Worker *this)

{
  pointer ppCVar1;
  SharedBarrier *this_00;
  void *in_RSI;
  pointer ppCVar2;
  
  ppCVar1 = (this->containers_).super__Vector_base<Container_*,_std::allocator<Container_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->containers_).super__Vector_base<Container_*,_std::allocator<Container_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1
      ) {
    this_00 = Container::get_barrier(*ppCVar2);
    SharedBarrier::wait(this_00,in_RSI);
  }
  SharedBarrier::wait(&this->run_start_barrier_,in_RSI);
  return;
}

Assistant:

void Worker::run_tasks() {
    // Containers are wait()ing for tasks on their barriers
    for (auto *container : containers_) {
        container->get_barrier()->wait();
    }
    // Wait for run start
    run_start_barrier_.wait();
}